

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O0

void __thiscall crsGA::ThreadPool::~ThreadPool(ThreadPool *this)

{
  ThreadPool *this_local;
  
  std::atomic<bool>::operator=(&this->stop,true);
  ThreadSafeQueue<std::function<void_()>_>::notify_and_terminate(&this->tasks);
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::clear(&this->workers);
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::~vector(&this->workers);
  ThreadSafeQueue<std::function<void_()>_>::~ThreadSafeQueue(&this->tasks);
  return;
}

Assistant:

inline ThreadPool::~ThreadPool()
{
    stop = true;
    tasks.notify_and_terminate();
    workers.clear();
}